

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall QFileSystemModelPrivate::~QFileSystemModelPrivate(QFileSystemModelPrivate *this)

{
  uint uVar1;
  pointer this_00;
  QFileInfoGatherer *in_RDI;
  vector<QRegularExpression,_std::allocator<QRegularExpression>_> *unaff_retaddr;
  QFileInfoGatherer *rawGatherer;
  pointer in_stack_fffffffffffffff0;
  QFileInfoGatherer *this_01;
  
  *(undefined ***)in_RDI = &PTR__QFileSystemModelPrivate_00e24b58;
  this_01 = in_RDI;
  std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::operator->
            ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)0xaaad20);
  QFileInfoGatherer::requestAbort(this_01);
  this_00 = std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::operator->
                      ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)
                       0xaaad38);
  uVar1 = QThread::wait(&this_00->super_QThread,(void *)0x3e8);
  if ((uVar1 & 1) == 0) {
    in_stack_fffffffffffffff0 =
         std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::release
                   ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)
                    0xaaad59);
    QObject::deleteLater();
  }
  QBasicTimer::~QBasicTimer((QBasicTimer *)in_stack_fffffffffffffff0);
  QList<QFileSystemModelPrivate::Fetching>::~QList
            ((QList<QFileSystemModelPrivate::Fetching> *)0xaaad88);
  QFileSystemNode::~QFileSystemNode((QFileSystemNode *)in_stack_fffffffffffffff0);
  QHash<QString,_QString>::~QHash((QHash<QString,_QString> *)in_stack_fffffffffffffff0);
  std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::~vector(unaff_retaddr);
  QList<QString>::~QList((QList<QString> *)0xaaadc8);
  QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool>::~QHash
            ((QHash<const_QFileSystemModelPrivate::QFileSystemNode_*,_bool> *)
             in_stack_fffffffffffffff0);
  QTimer::~QTimer((QTimer *)&in_RDI[1].m_watching);
  std::unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>::~unique_ptr
            ((unique_ptr<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_> *)
             in_stack_fffffffffffffff0);
  QDir::~QDir((QDir *)&in_RDI[1].defaultProvider);
  QAbstractItemModelPrivate::~QAbstractItemModelPrivate((QAbstractItemModelPrivate *)in_RDI);
  return;
}

Assistant:

QFileSystemModelPrivate::~QFileSystemModelPrivate()
{
#if QT_CONFIG(filesystemwatcher)
    fileInfoGatherer->requestAbort();
    if (!fileInfoGatherer->wait(1000)) {
        // If the thread hangs, perhaps because the network was disconnected
        // while the gatherer was stat'ing a remote file, then don't block
        // shutting down the model (which might block a file dialog and the
        // main thread). Schedule the gatherer for later deletion; it's
        // destructor will wait for the thread to finish.
        auto *rawGatherer = fileInfoGatherer.release();
        rawGatherer->deleteLater();
    }
#endif // filesystemwatcher
}